

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

bool __thiscall QTreeView::isIndexHidden(QTreeView *this,QModelIndex *index)

{
  long lVar1;
  bool bVar2;
  QModelIndex *in_RSI;
  QTreeView *in_RDI;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffffbc;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 uVar3;
  QTreeView *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QModelIndex::column(in_RSI);
  bVar2 = isColumnHidden(in_RDI,in_stack_ffffffffffffffbc);
  uVar3 = true;
  if (!bVar2) {
    QModelIndex::row(in_RSI);
    QModelIndex::parent(in_RSI);
    uVar3 = isRowHidden(this_00,(int)((ulong)in_RSI >> 0x20),
                        (QModelIndex *)CONCAT17(uVar3,in_stack_ffffffffffffffc8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)uVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QTreeView::isIndexHidden(const QModelIndex &index) const
{
    return (isColumnHidden(index.column()) || isRowHidden(index.row(), index.parent()));
}